

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateArraySetup(ExpressionEvalContext *ctx,ExprArraySetup *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  bool bVar3;
  int iVar4;
  TypeBase *pTVar5;
  ExprBase *pEVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  _func_int **pp_Var8;
  _func_int **ptr;
  long lVar9;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    pTVar5 = expression->lhs->type;
    if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
      pTVar5 = (TypeBase *)0x0;
    }
    if (pTVar5 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x70f,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pp_Var8 = pTVar5[1]._vptr_TypeBase;
    if ((pp_Var8 == (_func_int **)0x0) || (*(int *)(pp_Var8 + 1) != 0x13)) {
      pp_Var8 = (_func_int **)0x0;
    }
    if (pp_Var8 == (_func_int **)0x0) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x713,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pEVar6 = Evaluate(ctx,expression->initializer);
    if (pEVar6 != (ExprBase *)0x0) {
      pEVar7 = Evaluate(ctx,expression->lhs);
      if ((pEVar7 == (ExprBase *)0x0) || (pEVar7->typeID != 0xc)) {
        pEVar7 = (ExprBase *)0x0;
      }
      if (pEVar7 != (ExprBase *)0x0) {
        if (*(int *)(pp_Var8 + 0xd) != 0) {
          lVar9 = 0;
          do {
            if (ctx->instructionsLimit <= ctx->instruction) {
              Report(ctx,"ERROR: instruction limit reached");
              return (ExprBase *)0x0;
            }
            ctx->instruction = ctx->instruction + 1;
            ptr = (_func_int **)
                  (*(long *)(pp_Var8[0xc] + 0x30) * lVar9 + (long)pEVar7[1]._vptr_ExprBase);
            if (*(ulong *)&pEVar7[1].typeID < (ulong)((long)ptr + *(long *)(pp_Var8[0xc] + 0x30))) {
              __assert_fail("ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x725,
                            "ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                           );
            }
            pAVar1 = ctx->ctx->allocator;
            iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
            pSVar2 = (expression->super_ExprBase).source;
            type = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pp_Var8[0xc]);
            ExprPointerLiteral::ExprPointerLiteral
                      ((ExprPointerLiteral *)CONCAT44(extraout_var,iVar4),pSVar2,
                       &type->super_TypeBase,(uchar *)ptr,
                       (uchar *)((long)ptr + *(long *)(pp_Var8[0xc] + 0x30)));
            bVar3 = CreateStore(ctx,(ExprBase *)CONCAT44(extraout_var,iVar4),pEVar6);
            if (!bVar3) {
              return (ExprBase *)0x0;
            }
            lVar9 = lVar9 + 1;
          } while ((uint)lVar9 < *(uint *)(pp_Var8 + 0xd));
        }
        pAVar1 = ctx->ctx->allocator;
        iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        pSVar2 = (expression->super_ExprBase).source;
        pTVar5 = ctx->ctx->typeVoid;
        pEVar6->typeID = 2;
        pEVar6->source = pSVar2;
        pEVar6->type = pTVar5;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
        pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
        return pEVar6;
      }
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArraySetup(ExpressionEvalContext &ctx, ExprArraySetup *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	ExprBase *initializer = Evaluate(ctx, expression->initializer);

	if(!initializer)
		return NULL;

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->lhs));

	if(!ptr)
		return NULL;

	for(unsigned i = 0; i < unsigned(arrayType->length); i++)
	{
		if(!AddInstruction(ctx))
			return NULL;

		assert(ptr);
		assert(ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end);

		unsigned char *targetPtr = ptr->ptr + i * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, shifted, initializer))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}